

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O2

void __thiscall unitStrings_siPrefixes_Test::TestBody(unitStrings_siPrefixes_Test *this)

{
  uint64_t uVar1;
  precise_unit *ppVar2;
  uint64_t in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  char *pcVar4;
  allocator local_309;
  precise_unit local_308;
  AssertionResult gtest_ar;
  string local_2e8;
  string local_2c8;
  string local_2a8;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  string local_1a8;
  string local_188;
  string local_168;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  string local_28;
  
  std::__cxx11::string::string((string *)&local_28,"mm",&local_309);
  uVar1 = units::getDefaultFlags();
  local_308 = units::unit_from_string(&local_28,uVar1);
  ppVar2 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_2e8,(units *)&local_308,ppVar2,in_RCX);
  pbVar3 = &local_2e8;
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[3]>
            ((internal *)&gtest_ar,"to_string(unit_from_string(\"mm\"))","\"mm\"",pbVar3,
             (char (*) [3])0x1d967e);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_28);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_2e8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x78;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_308,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x78,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_308,(Message *)&local_2e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_308);
    if ((long *)local_2e8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_2e8._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__cxx11::string::string((string *)&local_48,"cm",&local_309);
  uVar1 = units::getDefaultFlags();
  local_308 = units::unit_from_string(&local_48,uVar1);
  ppVar2 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_2e8,(units *)&local_308,ppVar2,(uint64_t)pbVar3);
  pbVar3 = &local_2e8;
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[3]>
            ((internal *)&gtest_ar,"to_string(unit_from_string(\"cm\"))","\"cm\"",pbVar3,
             (char (*) [3])0x1d8495);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_48);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_2e8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x79;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_308,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x79,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_308,(Message *)&local_2e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_308);
    if ((long *)local_2e8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_2e8._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__cxx11::string::string((string *)&local_68,"um",&local_309);
  uVar1 = units::getDefaultFlags();
  local_308 = units::unit_from_string(&local_68,uVar1);
  ppVar2 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_2e8,(units *)&local_308,ppVar2,(uint64_t)pbVar3);
  pbVar3 = &local_2e8;
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[3]>
            ((internal *)&gtest_ar,"to_string(unit_from_string(\"um\"))","\"um\"",pbVar3,
             (char (*) [3])0x1e97a1);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_68);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_2e8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x7a;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_308,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x7a,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_308,(Message *)&local_2e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_308);
    if ((long *)local_2e8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_2e8._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__cxx11::string::string((string *)&local_88,"nm",&local_309);
  uVar1 = units::getDefaultFlags();
  local_308 = units::unit_from_string(&local_88,uVar1);
  ppVar2 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_2e8,(units *)&local_308,ppVar2,(uint64_t)pbVar3);
  pbVar3 = &local_2e8;
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[3]>
            ((internal *)&gtest_ar,"to_string(unit_from_string(\"nm\"))","\"nm\"",pbVar3,
             (char (*) [3])"nm");
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_88);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_2e8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x7b;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_308,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x7b,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_308,(Message *)&local_2e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_308);
    if ((long *)local_2e8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_2e8._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__cxx11::string::string((string *)&local_a8,"pm",&local_309);
  uVar1 = units::getDefaultFlags();
  local_308 = units::unit_from_string(&local_a8,uVar1);
  ppVar2 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_2e8,(units *)&local_308,ppVar2,(uint64_t)pbVar3);
  pbVar3 = &local_2e8;
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[3]>
            ((internal *)&gtest_ar,"to_string(unit_from_string(\"pm\"))","\"pm\"",pbVar3,
             (char (*) [3])0x1e777b);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_a8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_2e8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x7c;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_308,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x7c,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_308,(Message *)&local_2e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_308);
    if ((long *)local_2e8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_2e8._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__cxx11::string::string((string *)&local_c8,"fm",&local_309);
  uVar1 = units::getDefaultFlags();
  local_308 = units::unit_from_string(&local_c8,uVar1);
  ppVar2 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_2e8,(units *)&local_308,ppVar2,(uint64_t)pbVar3);
  pbVar3 = &local_2e8;
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[3]>
            ((internal *)&gtest_ar,"to_string(unit_from_string(\"fm\"))","\"fm\"",pbVar3,
             (char (*) [3])0x1e7c15);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_c8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_2e8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x7d;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_308,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x7d,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_308,(Message *)&local_2e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_308);
    if ((long *)local_2e8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_2e8._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__cxx11::string::string((string *)&local_e8,"am",&local_309);
  uVar1 = units::getDefaultFlags();
  local_308 = units::unit_from_string(&local_e8,uVar1);
  ppVar2 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_2e8,(units *)&local_308,ppVar2,(uint64_t)pbVar3);
  pbVar3 = &local_2e8;
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[3]>
            ((internal *)&gtest_ar,"to_string(unit_from_string(\"am\"))","\"am\"",pbVar3,
             (char (*) [3])0x1ef124);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_e8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_2e8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x7e;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_308,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x7e,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_308,(Message *)&local_2e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_308);
    if ((long *)local_2e8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_2e8._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__cxx11::string::string((string *)&local_108,"zm",&local_309);
  uVar1 = units::getDefaultFlags();
  local_308 = units::unit_from_string(&local_108,uVar1);
  ppVar2 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_2e8,(units *)&local_308,ppVar2,(uint64_t)pbVar3);
  pbVar3 = &local_2e8;
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[3]>
            ((internal *)&gtest_ar,"to_string(unit_from_string(\"zm\"))","\"zm\"",pbVar3,
             (char (*) [3])"zm");
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_108);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_2e8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x7f;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_308,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x7f,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_308,(Message *)&local_2e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_308);
    if ((long *)local_2e8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_2e8._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__cxx11::string::string((string *)&local_128,"ym",&local_309);
  uVar1 = units::getDefaultFlags();
  local_308 = units::unit_from_string(&local_128,uVar1);
  ppVar2 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_2e8,(units *)&local_308,ppVar2,(uint64_t)pbVar3);
  pbVar3 = &local_2e8;
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[3]>
            ((internal *)&gtest_ar,"to_string(unit_from_string(\"ym\"))","\"ym\"",pbVar3,
             (char (*) [3])"ym");
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_128);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_2e8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x80;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_308,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x80,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_308,(Message *)&local_2e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_308);
    if ((long *)local_2e8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_2e8._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__cxx11::string::string((string *)&local_148,"dm",&local_309);
  uVar1 = units::getDefaultFlags();
  local_308 = units::unit_from_string(&local_148,uVar1);
  ppVar2 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_2e8,(units *)&local_308,ppVar2,(uint64_t)pbVar3);
  pbVar3 = &local_2e8;
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[3]>
            ((internal *)&gtest_ar,"to_string(unit_from_string(\"dm\"))","\"dm\"",pbVar3,
             (char (*) [3])"dm");
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_148);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_2e8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x81;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_308,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x81,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_308,(Message *)&local_2e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_308);
    if ((long *)local_2e8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_2e8._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__cxx11::string::string((string *)&local_168,"rm",&local_309);
  uVar1 = units::getDefaultFlags();
  local_308 = units::unit_from_string(&local_168,uVar1);
  ppVar2 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_2e8,(units *)&local_308,ppVar2,(uint64_t)pbVar3);
  pbVar3 = &local_2e8;
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[3]>
            ((internal *)&gtest_ar,"to_string(unit_from_string(\"rm\"))","\"rm\"",pbVar3,
             (char (*) [3])0x1e507f);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_168);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_2e8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x82;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_308,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x82,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_308,(Message *)&local_2e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_308);
    if ((long *)local_2e8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_2e8._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__cxx11::string::string((string *)&local_188,"qm",&local_309);
  uVar1 = units::getDefaultFlags();
  local_308 = units::unit_from_string(&local_188,uVar1);
  ppVar2 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_2e8,(units *)&local_308,ppVar2,(uint64_t)pbVar3);
  pbVar3 = &local_2e8;
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[3]>
            ((internal *)&gtest_ar,"to_string(unit_from_string(\"qm\"))","\"qm\"",pbVar3,
             (char (*) [3])"qm");
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_188);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_2e8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x83;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_308,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x83,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_308,(Message *)&local_2e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_308);
    if ((long *)local_2e8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_2e8._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__cxx11::string::string((string *)&local_1a8,"km",&local_309);
  uVar1 = units::getDefaultFlags();
  local_308 = units::unit_from_string(&local_1a8,uVar1);
  ppVar2 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_2e8,(units *)&local_308,ppVar2,(uint64_t)pbVar3);
  pbVar3 = &local_2e8;
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[3]>
            ((internal *)&gtest_ar,"to_string(unit_from_string(\"km\"))","\"km\"",pbVar3,
             (char (*) [3])0x1d6834);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_1a8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_2e8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x85;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_308,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x85,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_308,(Message *)&local_2e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_308);
    if ((long *)local_2e8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_2e8._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__cxx11::string::string((string *)&local_1c8,"Km",&local_309);
  uVar1 = units::getDefaultFlags();
  local_308 = units::unit_from_string(&local_1c8,uVar1);
  ppVar2 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_2e8,(units *)&local_308,ppVar2,(uint64_t)pbVar3);
  pbVar3 = &local_2e8;
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[3]>
            ((internal *)&gtest_ar,"to_string(unit_from_string(\"Km\"))","\"km\"",pbVar3,
             (char (*) [3])0x1d6834);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_1c8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_2e8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x86;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_308,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x86,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_308,(Message *)&local_2e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_308);
    if ((long *)local_2e8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_2e8._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__cxx11::string::string((string *)&local_1e8,"Mm",&local_309);
  uVar1 = units::getDefaultFlags();
  local_308 = units::unit_from_string(&local_1e8,uVar1);
  ppVar2 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_2e8,(units *)&local_308,ppVar2,(uint64_t)pbVar3);
  pbVar3 = &local_2e8;
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[3]>
            ((internal *)&gtest_ar,"to_string(unit_from_string(\"Mm\"))","\"Mm\"",pbVar3,
             (char (*) [3])"Mm");
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_1e8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_2e8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x87;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_308,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x87,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_308,(Message *)&local_2e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_308);
    if ((long *)local_2e8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_2e8._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__cxx11::string::string((string *)&local_208,"Gm",&local_309);
  uVar1 = units::getDefaultFlags();
  local_308 = units::unit_from_string(&local_208,uVar1);
  ppVar2 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_2e8,(units *)&local_308,ppVar2,(uint64_t)pbVar3);
  pbVar3 = &local_2e8;
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[3]>
            ((internal *)&gtest_ar,"to_string(unit_from_string(\"Gm\"))","\"Gm\"",pbVar3,
             (char (*) [3])"Gm");
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_208);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_2e8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x88;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_308,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x88,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_308,(Message *)&local_2e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_308);
    if ((long *)local_2e8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_2e8._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__cxx11::string::string((string *)&local_228,"Tm",&local_309);
  uVar1 = units::getDefaultFlags();
  local_308 = units::unit_from_string(&local_228,uVar1);
  ppVar2 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_2e8,(units *)&local_308,ppVar2,(uint64_t)pbVar3);
  pbVar3 = &local_2e8;
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[3]>
            ((internal *)&gtest_ar,"to_string(unit_from_string(\"Tm\"))","\"Tm\"",pbVar3,
             (char (*) [3])"Tm");
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_228);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_2e8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x89;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_308,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x89,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_308,(Message *)&local_2e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_308);
    if ((long *)local_2e8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_2e8._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__cxx11::string::string((string *)&local_248,"Em",&local_309);
  uVar1 = units::getDefaultFlags();
  local_308 = units::unit_from_string(&local_248,uVar1);
  ppVar2 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_2e8,(units *)&local_308,ppVar2,(uint64_t)pbVar3);
  pbVar3 = &local_2e8;
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[3]>
            ((internal *)&gtest_ar,"to_string(unit_from_string(\"Em\"))","\"Em\"",pbVar3,
             (char (*) [3])"Em");
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_248);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_2e8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x8a;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_308,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x8a,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_308,(Message *)&local_2e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_308);
    if ((long *)local_2e8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_2e8._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__cxx11::string::string((string *)&local_268,"Zm",&local_309);
  uVar1 = units::getDefaultFlags();
  local_308 = units::unit_from_string(&local_268,uVar1);
  ppVar2 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_2e8,(units *)&local_308,ppVar2,(uint64_t)pbVar3);
  pbVar3 = &local_2e8;
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[3]>
            ((internal *)&gtest_ar,"to_string(unit_from_string(\"Zm\"))","\"Zm\"",pbVar3,
             (char (*) [3])"Zm");
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_268);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_2e8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x8b;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_308,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x8b,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_308,(Message *)&local_2e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_308);
    if ((long *)local_2e8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_2e8._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__cxx11::string::string((string *)&local_288,"Ym",&local_309);
  uVar1 = units::getDefaultFlags();
  local_308 = units::unit_from_string(&local_288,uVar1);
  ppVar2 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_2e8,(units *)&local_308,ppVar2,(uint64_t)pbVar3);
  pbVar3 = &local_2e8;
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[3]>
            ((internal *)&gtest_ar,"to_string(unit_from_string(\"Ym\"))","\"Ym\"",pbVar3,
             (char (*) [3])"Ym");
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_288);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_2e8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x8c;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_308,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x8c,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_308,(Message *)&local_2e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_308);
    if ((long *)local_2e8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_2e8._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__cxx11::string::string((string *)&local_2a8,"Rm",&local_309);
  uVar1 = units::getDefaultFlags();
  local_308 = units::unit_from_string(&local_2a8,uVar1);
  ppVar2 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_2e8,(units *)&local_308,ppVar2,(uint64_t)pbVar3);
  pbVar3 = &local_2e8;
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[3]>
            ((internal *)&gtest_ar,"to_string(unit_from_string(\"Rm\"))","\"Rm\"",pbVar3,
             (char (*) [3])"Rm");
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_2a8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_2e8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x8d;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_308,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x8d,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_308,(Message *)&local_2e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_308);
    if ((long *)local_2e8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_2e8._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__cxx11::string::string((string *)&local_2c8,"Qm",&local_309);
  uVar1 = units::getDefaultFlags();
  local_308 = units::unit_from_string(&local_2c8,uVar1);
  ppVar2 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_2e8,(units *)&local_308,ppVar2,(uint64_t)pbVar3);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[3]>
            ((internal *)&gtest_ar,"to_string(unit_from_string(\"Qm\"))","\"Qm\"",&local_2e8,
             (char (*) [3])"Qm");
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_2c8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_2e8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_308,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x8e,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_308,(Message *)&local_2e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_308);
    if ((long *)local_2e8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_2e8._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(unitStrings, siPrefixes)
{
    EXPECT_EQ(to_string(unit_from_string("mm")), "mm");
    EXPECT_EQ(to_string(unit_from_string("cm")), "cm");
    EXPECT_EQ(to_string(unit_from_string("um")), "um");
    EXPECT_EQ(to_string(unit_from_string("nm")), "nm");
    EXPECT_EQ(to_string(unit_from_string("pm")), "pm");
    EXPECT_EQ(to_string(unit_from_string("fm")), "fm");
    EXPECT_EQ(to_string(unit_from_string("am")), "am");
    EXPECT_EQ(to_string(unit_from_string("zm")), "zm");
    EXPECT_EQ(to_string(unit_from_string("ym")), "ym");
    EXPECT_EQ(to_string(unit_from_string("dm")), "dm");
    EXPECT_EQ(to_string(unit_from_string("rm")), "rm");
    EXPECT_EQ(to_string(unit_from_string("qm")), "qm");

    EXPECT_EQ(to_string(unit_from_string("km")), "km");
    EXPECT_EQ(to_string(unit_from_string("Km")), "km");
    EXPECT_EQ(to_string(unit_from_string("Mm")), "Mm");
    EXPECT_EQ(to_string(unit_from_string("Gm")), "Gm");
    EXPECT_EQ(to_string(unit_from_string("Tm")), "Tm");
    EXPECT_EQ(to_string(unit_from_string("Em")), "Em");
    EXPECT_EQ(to_string(unit_from_string("Zm")), "Zm");
    EXPECT_EQ(to_string(unit_from_string("Ym")), "Ym");
    EXPECT_EQ(to_string(unit_from_string("Rm")), "Rm");
    EXPECT_EQ(to_string(unit_from_string("Qm")), "Qm");
}